

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<int,_4> *write_value,
          Vector<int,_4> *expected_value)

{
  CallLogWrapper *pCVar1;
  undefined1 uVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLenum internalformat_00;
  Vector<int,_4> *in_R8;
  Vector<int,_4> *pVVar5;
  _Alloc_hider expected_value_00;
  int i_1;
  int i;
  GLuint texture_result;
  GLuint textures [8];
  vec4 color;
  Vector<int,_4> data;
  string source;
  GLenum internalformat_01;
  
  internalformat_00 = (GLenum)write_value;
  internalformat_01 = (GLenum)expected_value;
  switch(*(undefined4 *)(this + 0x2c)) {
  case 0:
    GenStoreShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)0x0,internalformat,internalformat_00,in_R8);
    pVVar5 = (Vector<int,_4> *)0x0;
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,
               (char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,
               internalformat_01,pVVar5);
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,
               (char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case 1:
    GenStoreShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)&DAT_00000001,internalformat,internalformat_00,in_R8);
    pVVar5 = (Vector<int,_4> *)0x0;
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
               source._M_dataplus._M_p,
               "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",(char *)0x0,
               (char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,
               internalformat_01,pVVar5);
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
               source._M_dataplus._M_p,
               "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",(char *)0x0,
               (char *)0x0,(bool *)0x0);
    break;
  case 2:
    GenStoreShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)0x2,internalformat,internalformat_00,in_R8);
    pVVar5 = (Vector<int,_4> *)0x0;
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",(char *)0x0,
               source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,
               internalformat_01,pVVar5);
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",(char *)0x0,
               source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case 3:
    GenStoreShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)0x3,internalformat,internalformat_00,in_R8);
    expected_value_00 = source._M_dataplus;
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",(char *)0x0,
               (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,
               internalformat_01,(Vector<int,_4> *)expected_value_00._M_p);
    gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
              ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",(char *)0x0,
               (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    break;
  case 4:
    GenStoreShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)&DAT_00000004,internalformat,internalformat_00,in_R8);
    textures._0_8_ = source._M_dataplus._M_p;
    pCVar1 = (CallLogWrapper *)(this + 8);
    GVar3 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
    pVVar5 = (Vector<int,_4> *)0x0;
    glu::CallLogWrapper::glShaderSource(pCVar1,GVar3,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar3);
    GVar4 = glu::CallLogWrapper::glCreateProgram(pCVar1);
    glu::CallLogWrapper::glAttachShader(pCVar1,GVar4,GVar3);
    glu::CallLogWrapper::glLinkProgram(pCVar1,GVar4);
    glu::CallLogWrapper::glDeleteShader(pCVar1,GVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,
               internalformat_01,pVVar5);
    textures._0_8_ = source._M_dataplus._M_p;
    GVar3 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
    glu::CallLogWrapper::glShaderSource(pCVar1,GVar3,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar3);
    GVar4 = glu::CallLogWrapper::glCreateProgram(pCVar1);
    glu::CallLogWrapper::glAttachShader(pCVar1,GVar4,GVar3);
    glu::CallLogWrapper::glLinkProgram(pCVar1,GVar4);
    glu::CallLogWrapper::glDeleteShader(pCVar1,GVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p == &source.field_2) goto LAB_009b907c;
    goto LAB_009b905a;
  default:
    goto LAB_009b907c;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
LAB_009b905a:
    operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
  }
LAB_009b907c:
  pCVar1 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(pCVar1,8,textures);
  glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage1D(pCVar1,0xde0,1,internalformat,1);
  uVar2 = FUN_009b9214();
  return (bool)uVar2;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_2D,
								   GL_TEXTURE_3D,		GL_TEXTURE_RECTANGLE,
								   GL_TEXTURE_CUBE_MAP, GL_TEXTURE_1D_ARRAY,
								   GL_TEXTURE_2D_ARRAY, GL_TEXTURE_CUBE_MAP_ARRAY };
		const int kTargets		= sizeof(targets) / sizeof(targets[0]);
		GLuint	program_store = 0;
		GLuint	program_load  = 0;
		if (m_stage == 0)
		{ // VS
			program_store =
				BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL, NULL, NULL);
			program_load =
				BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL, NULL, NULL);
		}
		else if (m_stage == 1)
		{ // TCS
			const char* const glsl_vs  = "#version 420 core" NL "void main() {}";
			const char* const glsl_tes = "#version 420 core" NL "layout(quads, point_mode) in;" NL "void main() {}";
			program_store = BuildProgram(glsl_vs, GenStoreShader(m_stage, internalformat, write_value).c_str(),
										 glsl_tes, NULL, NULL);
			program_load = BuildProgram(glsl_vs, GenLoadShader(m_stage, internalformat, expected_value).c_str(),
										glsl_tes, NULL, NULL);
		}
		else if (m_stage == 2)
		{ // TES
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL);
		}
		else if (m_stage == 3)
		{ // GS
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL);
		}
		else if (m_stage == 4)
		{ // CS
			{
				std::string		  source = GenStoreShader(m_stage, internalformat, write_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_store = glCreateProgram();
				glAttachShader(program_store, sh);
				glLinkProgram(program_store);
				glDeleteShader(sh);
			}
			{
				std::string		  source = GenLoadShader(m_stage, internalformat, expected_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_load = glCreateProgram();
				glAttachShader(program_load, sh);
				glLinkProgram(program_load);
				glDeleteShader(sh);
			}
		}
		GLuint textures[kTargets], texture_result;
		glGenTextures(kTargets, textures);
		glGenTextures(1, &texture_result);

		glBindTexture(GL_TEXTURE_2D, texture_result);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 1, 1);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_1D)
			{
				glTexStorage1D(targets[i], 1, internalformat, 1);
			}
			else if (targets[i] == GL_TEXTURE_2D || targets[i] == GL_TEXTURE_RECTANGLE)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 12);
			}
			else if (targets[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 2);
			}
		}
		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program_store);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_store, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube_array"), 7);

		glBindVertexArray(m_vao);
		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		bool status = true;
		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				for (int face = 0; face < 6; ++face)
				{
					T data;
					glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
					if (!Equal(data, expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
			else
			{
				T data[12];
				memset(&data[0], 0, sizeof(data));
				glGetTexImage(targets[i], 0, Format<T>(), Type<T>(), &data[0]);

				int count = 1;
				if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
					count = 2;
				else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
					count = 12;
				else if (targets[i] == GL_TEXTURE_1D_ARRAY)
					count = 2;

				for (int j = 0; j < count; ++j)
				{
					if (!Equal(data[j], expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data[j]).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
		}
		glBindImageTexture(0, texture_result, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glUseProgram(program_load);
		glUniform1i(glGetUniformLocation(program_load, "g_image_result"), 0);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_load, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_load, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube_array"), 7);

		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}
		{
			vec4 color;
			glBindTexture(GL_TEXTURE_2D, texture_result);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &color[0]);
			if (!tcu::allEqual(color, vec4(0, 1, 0, 1)))
			{
				status = false;
				Output("Color is: %s. Format is: %s. Stage is: %s.\n", ToString(color).c_str(),
					   FormatEnumToString(internalformat).c_str(), StageName(m_stage));
			}
		}
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		glDeleteTextures(1, &texture_result);
		return status;
	}